

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void test_options(void)

{
  bool bVar1;
  type pjVar2;
  json *pjVar3;
  pointer pjVar4;
  string *psVar5;
  ostream *poVar6;
  json_parser_exception *e_5;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j1_4;
  parser p_5;
  stream_reader r_5;
  string local_ad00 [32];
  istringstream local_ace0 [8];
  istringstream is_3;
  json_parser_exception *e_4;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j1_3;
  parser p_4;
  stream_reader r_4;
  string local_8ae8 [32];
  istringstream local_8ac8 [8];
  istringstream is_2;
  json_parser_exception *e_3;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j1_2;
  parser p_3;
  stream_reader r_3;
  string local_68d0 [32];
  istringstream local_68b0 [8];
  istringstream is_1;
  json_parser_exception *e_2;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j1_1;
  parser p_2;
  stream_reader r_2;
  string local_46b8 [32];
  istringstream local_4698 [8];
  istringstream is;
  exception *e_1;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j3;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j2;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j1;
  parser p_1;
  stream_reader r_1;
  ifstream f_1;
  json_io_exception *e;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j;
  parser p;
  stream_reader r;
  istream local_210 [8];
  ifstream f;
  
  std::ifstream::ifstream(local_210,"test_files/test2.json",8);
  argo::stream_reader::stream_reader((stream_reader *)&p.m_convert_numbers,local_210,100,true);
  argo::parser::parser((parser *)&j,(reader *)&p.m_convert_numbers,true,0x19000,1000,true,true,true)
  ;
  argo::parser::parse((parser *)&e);
  std::operator<<((ostream *)jlog,"FAIL: message too long but parsed anyway\n");
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&e);
  argo::stream_reader::~stream_reader((stream_reader *)&p.m_convert_numbers);
  std::ifstream::~ifstream(local_210);
  std::ifstream::ifstream(&r_1.m_stream,"test_files/test6.json",8);
  argo::stream_reader::stream_reader
            ((stream_reader *)&p_1.m_convert_numbers,(istream *)&r_1.m_stream,1000,false);
  argo::parser::parser
            ((parser *)&j1,(reader *)&p_1.m_convert_numbers,false,0x19000,1000,true,true,true);
  argo::parser::parse((parser *)&j2);
  pjVar2 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*(&j2);
  pjVar3 = argo::json::operator[](pjVar2,"one");
  bVar1 = argo::json::operator!=(pjVar3,1);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: first message broken\n");
  }
  argo::parser::parse((parser *)&j3);
  pjVar2 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*(&j3);
  pjVar3 = argo::json::operator[](pjVar2,"two");
  bVar1 = argo::json::operator!=(pjVar3,2);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: second message broken\n");
  }
  argo::parser::parse((parser *)&e_1);
  pjVar2 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                     ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&e_1);
  pjVar3 = argo::json::operator[](pjVar2,"three");
  bVar1 = argo::json::operator!=(pjVar3,3);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: third message broken\n");
  }
  std::operator<<((ostream *)jlog,"PASS: parsed three messages from file\n");
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&e_1);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j3);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j2);
  argo::stream_reader::~stream_reader((stream_reader *)&p_1.m_convert_numbers);
  std::ifstream::~ifstream(&r_1.m_stream);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_46b8,"99999999999999999999",(allocator *)((long)&r_2.m_stream + 7));
  std::__cxx11::istringstream::istringstream(local_4698,local_46b8,8);
  std::__cxx11::string::~string(local_46b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r_2.m_stream + 7));
  argo::stream_reader::stream_reader
            ((stream_reader *)&p_2.m_convert_numbers,(istream *)local_4698,1000,false);
  argo::parser::parser
            ((parser *)&j1_1,(reader *)&p_2.m_convert_numbers,true,1000,1000,true,false,true);
  argo::parser::parse((parser *)&e_2);
  std::operator<<((ostream *)jlog,
                  "FAIL: int that was too large to be an int didn\'t cause an exception\n");
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&e_2);
  argo::stream_reader::~stream_reader((stream_reader *)&p_2.m_convert_numbers);
  std::__cxx11::istringstream::~istringstream(local_4698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68d0,"99999999999999999999.99",(allocator *)((long)&r_3.m_stream + 7));
  std::__cxx11::istringstream::istringstream(local_68b0,local_68d0,8);
  std::__cxx11::string::~string(local_68d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r_3.m_stream + 7));
  argo::stream_reader::stream_reader
            ((stream_reader *)&p_3.m_convert_numbers,(istream *)local_68b0,1000,false);
  argo::parser::parser
            ((parser *)&j1_2,(reader *)&p_3.m_convert_numbers,true,1000,1000,false,true,true);
  argo::parser::parse((parser *)&e_3);
  pjVar4 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator->
                     ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&e_3);
  psVar5 = argo::json::get_raw_value_abi_cxx11_(pjVar4);
  bVar1 = std::operator==(psVar5,"99999999999999999999.99");
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: don\'t convert number returned the correct raw value\n");
  }
  else {
    std::operator<<((ostream *)jlog,"FAIL: don\'t convert number returned an incorrect raw value\n")
    ;
  }
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&e_3);
  argo::stream_reader::~stream_reader((stream_reader *)&p_3.m_convert_numbers);
  std::__cxx11::istringstream::~istringstream(local_68b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_8ae8,"\" lkjlkj lkjlkj \\x \\y \"",(allocator *)((long)&r_4.m_stream + 7));
  std::__cxx11::istringstream::istringstream(local_8ac8,local_8ae8,8);
  std::__cxx11::string::~string(local_8ae8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r_4.m_stream + 7));
  argo::stream_reader::stream_reader
            ((stream_reader *)&p_4.m_convert_numbers,(istream *)local_8ac8,1000,false);
  argo::parser::parser
            ((parser *)&j1_3,(reader *)&p_4.m_convert_numbers,true,1000,1000,true,true,false);
  argo::parser::parse((parser *)&e_4);
  pjVar4 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator->
                     ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&e_4);
  psVar5 = argo::json::get_raw_value_abi_cxx11_(pjVar4);
  bVar1 = std::operator==(psVar5," lkjlkj lkjlkj \\x \\y ");
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: don\'t convert string returned the correct raw value\n");
  }
  else {
    poVar6 = std::operator<<((ostream *)jlog,
                             "FAIL: don\'t convert string returned an incorrect raw value:\'");
    pjVar4 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator->
                       ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&e_4);
    psVar5 = argo::json::get_raw_value_abi_cxx11_(pjVar4);
    poVar6 = std::operator<<(poVar6,(string *)psVar5);
    poVar6 = std::operator<<(poVar6,"\'");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&e_4);
  argo::stream_reader::~stream_reader((stream_reader *)&p_4.m_convert_numbers);
  std::__cxx11::istringstream::~istringstream(local_8ac8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ad00,"[[[[[[[[[[]]]]]]]]]]",(allocator *)((long)&r_5.m_stream + 7));
  std::__cxx11::istringstream::istringstream(local_ace0,local_ad00,8);
  std::__cxx11::string::~string(local_ad00);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r_5.m_stream + 7));
  argo::stream_reader::stream_reader
            ((stream_reader *)&p_5.m_convert_numbers,(istream *)local_ace0,1000,false);
  argo::parser::parser((parser *)&j1_4,(reader *)&p_5.m_convert_numbers,true,1000,9,true,true,true);
  argo::parser::parse((parser *)&e_5);
  std::operator<<((ostream *)jlog,"FAIL: nesting depth exceeded didn\'t cause exception\n");
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&e_5);
  argo::stream_reader::~stream_reader((stream_reader *)&p_5.m_convert_numbers);
  std::__cxx11::istringstream::~istringstream(local_ace0);
  return;
}

Assistant:

void test_options()
{
    // test message length limit
    {
        try
        {
            ifstream f("test_files/test2.json");
            stream_reader r(&f, 100, true);
            parser p(r);
            auto j = p.parse();
            jlog << "FAIL: message too long but parsed anyway\n";
        }
        catch (json_io_exception &e)
        {
            if (e.get_type() == json_exception::message_too_long_e)
            {
                jlog << "PASS: message too long threw correct exception type\n";
            }
            else
            {
                jlog << "FAIL: message too long threw incorrect exception type\n";
            }
        }
    }

    // test reading more than one message from file (in byte read mode)
    {
        try
        {
            ifstream f("test_files/test6.json");
            stream_reader r(&f, 1000, false);
            parser p(r, false);
            auto j1 = p.parse();
            if ((*j1)["one"] != 1)
            {
                jlog << "FAIL: first message broken\n";
            }
            auto j2 = p.parse();
            if ((*j2)["two"] != 2)
            {
                jlog << "FAIL: second message broken\n";
            }
            auto j3 = p.parse();
            if ((*j3)["three"] != 3)
            {
                jlog << "FAIL: third message broken\n";
            }
            jlog << "PASS: parsed three messages from file\n";
        }
        catch (exception &e)
        {
            jlog << "FAIL: failed to parse three messages from file : " << e.what() << endl;
        }
    }

    // test don't fallback to doubles for large ints
    {
        try
        {
            istringstream is("99999999999999999999");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 1000, true, false, true);
            auto j1 = p.parse();
            jlog << "FAIL: int that was too large to be an int didn't cause an exception\n";
        }
        catch (json_parser_exception &e)
        {
            if (e.get_type() == json_exception::number_out_of_range_e)
            {
                jlog << "PASS: int that was too large to be an int threw correct exception type\n";
            }
            else
            {
                jlog << "FAIL: int that was too large to be an int threw incorrect exception type\n";
            }
        }
    }

    // test don't convert numbers
    {
        try
        {
            istringstream is("99999999999999999999.99");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 1000, false, true, true);
            auto j1 = p.parse();
            if (j1->get_raw_value() == "99999999999999999999.99")
            {
                jlog << "PASS: don't convert number returned the correct raw value\n";
            }
            else
            {
                jlog << "FAIL: don't convert number returned an incorrect raw value\n";
            }
        }
        catch (json_parser_exception &e)
        {
            jlog << "FAIL: don't convert number threw an exception\n";
        }
    }

    // test don't convert strings
    {
        try
        {
            istringstream is("\" lkjlkj lkjlkj \\x \\y \"");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 1000, true, true, false);
            auto j1 = p.parse();
            if (j1->get_raw_value() == " lkjlkj lkjlkj \\x \\y ")
            {
                jlog << "PASS: don't convert string returned the correct raw value\n";
            }
            else
            {
                jlog << "FAIL: don't convert string returned an incorrect raw value:'" << j1->get_raw_value() << "'" << endl;
            }
        }
        catch (json_parser_exception &e)
        {
            jlog << "FAIL: don't convert string threw an exception\n";
        }
    }

    // test nesting depth limit
    {
        try
        {
            istringstream is("[[[[[[[[[[]]]]]]]]]]");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 9, true, true, true);
            auto j1 = p.parse();
            jlog << "FAIL: nesting depth exceeded didn't cause exception\n";
        }
        catch (json_parser_exception &e)
        {
            if (e.get_type() == json_exception::maximum_nesting_depth_exceeded_e)
            {
                jlog << "PASS: message nested too deeply threw correct exception type\n";
            }
            else
            {
                jlog << "FAIL: message nested too deeply threw incorrect exception type\n";
            }
        }
    }
}